

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall nonstd::optional_bare::optional<char>::value(optional<char> *this)

{
  bad_optional_access *this_00;
  bad_optional_access local_20;
  
  if (this->has_value_ != false) {
    return &this->value_;
  }
  this_00 = (bad_optional_access *)__cxa_allocate_exception(0x10);
  bad_optional_access::bad_optional_access(&local_20);
  bad_optional_access::bad_optional_access(this_00,&local_20);
  __cxa_throw(this_00,&bad_optional_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

value_type const & value() const
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
            throw bad_optional_access();
#endif
        return value_;
    }